

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O3

void NewState(pyhanabi_game_t *game,pyhanabi_state_t *state)

{
  HanabiGame *parent_game;
  HanabiState *this;
  
  if (state == (pyhanabi_state_t *)0x0) {
    __assert_fail("state != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                  ,0x124,"void NewState(pyhanabi_game_t *, pyhanabi_state_t *)");
  }
  if (game != (pyhanabi_game_t *)0x0) {
    parent_game = (HanabiGame *)game->game;
    if (parent_game != (HanabiGame *)0x0) {
      this = (HanabiState *)operator_new(0xa0);
      hanabi_learning_env::HanabiState::HanabiState(this,parent_game,-1);
      state->state = this;
      return;
    }
    __assert_fail("game->game != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                  ,0x126,"void NewState(pyhanabi_game_t *, pyhanabi_state_t *)");
  }
  __assert_fail("game != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                ,0x125,"void NewState(pyhanabi_game_t *, pyhanabi_state_t *)");
}

Assistant:

void NewState(pyhanabi_game_t* game, pyhanabi_state_t* state) {
  REQUIRE(state != nullptr);
  REQUIRE(game != nullptr);
  REQUIRE(game->game != nullptr);
  state->state = new hanabi_learning_env::HanabiState(
      static_cast<hanabi_learning_env::HanabiGame*>(game->game));
}